

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O0

char * IDAGetReturnFlagName(long flag)

{
  char *__s;
  undefined8 in_RDI;
  char *name;
  
  __s = (char *)malloc(0x18);
  switch(in_RDI) {
  case 0:
    sprintf(__s,"IDA_SUCCESS");
    break;
  case 1:
    sprintf(__s,"IDA_TSTOP_RETURN");
    break;
  case 2:
    sprintf(__s,"IDA_ROOT_RETURN");
    break;
  case 0xffffffffffffff95:
    sprintf(__s,"IDA_GETY_BADT");
    break;
  case 0xffffffffffffff96:
    sprintf(__s,"IDA_FWD_FAIL");
    break;
  case 0xffffffffffffff97:
    sprintf(__s,"IDA_REIFWD_FAIL");
    break;
  case 0xffffffffffffff98:
    sprintf(__s,"IDA_BAD_TB0");
    break;
  case 0xffffffffffffff99:
    sprintf(__s,"IDA_NO_BCK");
    break;
  case 0xffffffffffffff9a:
    sprintf(__s,"IDA_NO_FWD");
    break;
  case 0xffffffffffffff9b:
    sprintf(__s,"IDA_NO_ADJ");
    break;
  default:
    sprintf(__s,"NONE");
    break;
  case 0xffffffffffffffcb:
    sprintf(__s,"IDA_REP_QSRHS_ERR");
    break;
  case 0xffffffffffffffcd:
    sprintf(__s,"IDA_QSRHS_FAIL");
    break;
  case 0xffffffffffffffce:
    sprintf(__s,"IDA_NO_QUADSENS");
    break;
  case 0xffffffffffffffd5:
    sprintf(__s,"IDA_BAD_IS");
    break;
  case 0xffffffffffffffd6:
    sprintf(__s,"IDA_REP_SRES_ERR");
    break;
  case 0xffffffffffffffd7:
    sprintf(__s,"IDA_SRES_FAIL");
    break;
  case 0xffffffffffffffd8:
    sprintf(__s,"IDA_NO_SENS");
    break;
  case 0xffffffffffffffdf:
    sprintf(__s,"IDA_REP_QRHS_ERR");
    break;
  case 0xffffffffffffffe1:
    sprintf(__s,"IDA_QRHS_FAIL");
    break;
  case 0xffffffffffffffe2:
    sprintf(__s,"IDA_NO_QUAD");
    break;
  case 0xffffffffffffffe5:
    sprintf(__s,"IDA_BAD_DKY");
    break;
  case 0xffffffffffffffe6:
    sprintf(__s,"IDA_BAD_T");
    break;
  case 0xffffffffffffffe7:
    sprintf(__s,"IDA_BAD_K");
    break;
  case 0xffffffffffffffe8:
    sprintf(__s,"IDA_BAD_EWT");
    break;
  case 0xffffffffffffffe9:
    sprintf(__s,"IDA_NO_MALLOC");
    break;
  case 0xffffffffffffffea:
    sprintf(__s,"IDA_ILL_INPUT");
    break;
  case 0xffffffffffffffeb:
    sprintf(__s,"IDA_MEM_FAIL");
    break;
  case 0xffffffffffffffec:
    sprintf(__s,"IDA_MEM_NULL");
    break;
  case 0xffffffffffffffef:
    sprintf(__s,"IDA_NLS_FAIL");
    break;
  case 0xfffffffffffffff0:
    sprintf(__s,"IDA_NLS_SETUP_FAIL");
    break;
  case 0xfffffffffffffff2:
    sprintf(__s,"IDA_NO_RECOVERY");
    break;
  case 0xfffffffffffffff3:
    sprintf(__s,"IDA_LINESEARCH_FAIL");
    break;
  case 0xfffffffffffffff4:
    sprintf(__s,"IDA_FIRST_RES_FAIL");
    break;
  case 0xfffffffffffffff5:
    sprintf(__s,"IDA_CONSTR_FAIL");
    break;
  case 0xfffffffffffffff6:
    sprintf(__s,"IDA_RTFUNC_FAIL");
    break;
  case 0xfffffffffffffff7:
    sprintf(__s,"IDA_REP_RES_ERR");
    break;
  case 0xfffffffffffffff8:
    sprintf(__s,"IDA_RES_FAIL");
    break;
  case 0xfffffffffffffff9:
    sprintf(__s,"IDA_LSOLVE_FAIL");
    break;
  case 0xfffffffffffffffa:
    sprintf(__s,"IDA_LSETUP_FAIL");
    break;
  case 0xfffffffffffffffb:
    sprintf(__s,"IDA_LINIT_FAIL");
    break;
  case 0xfffffffffffffffc:
    sprintf(__s,"IDA_CONV_FAIL");
    break;
  case 0xfffffffffffffffd:
    sprintf(__s,"IDA_ERR_FAIL");
    break;
  case 0xfffffffffffffffe:
    sprintf(__s,"IDA_TOO_MUCH_ACC");
    break;
  case 0xffffffffffffffff:
    sprintf(__s,"IDA_TOO_MUCH_WORK");
  }
  return __s;
}

Assistant:

char* IDAGetReturnFlagName(long int flag)
{
  char* name;

  name = (char*)malloc(24 * sizeof(char));

  switch (flag)
  {
  case IDA_SUCCESS: sprintf(name, "IDA_SUCCESS"); break;
  case IDA_TSTOP_RETURN: sprintf(name, "IDA_TSTOP_RETURN"); break;
  case IDA_ROOT_RETURN: sprintf(name, "IDA_ROOT_RETURN"); break;
  case IDA_TOO_MUCH_WORK: sprintf(name, "IDA_TOO_MUCH_WORK"); break;
  case IDA_TOO_MUCH_ACC: sprintf(name, "IDA_TOO_MUCH_ACC"); break;
  case IDA_ERR_FAIL: sprintf(name, "IDA_ERR_FAIL"); break;
  case IDA_CONV_FAIL: sprintf(name, "IDA_CONV_FAIL"); break;
  case IDA_LINIT_FAIL: sprintf(name, "IDA_LINIT_FAIL"); break;
  case IDA_LSETUP_FAIL: sprintf(name, "IDA_LSETUP_FAIL"); break;
  case IDA_LSOLVE_FAIL: sprintf(name, "IDA_LSOLVE_FAIL"); break;
  case IDA_CONSTR_FAIL: sprintf(name, "IDA_CONSTR_FAIL"); break;
  case IDA_RES_FAIL: sprintf(name, "IDA_RES_FAIL"); break;
  case IDA_FIRST_RES_FAIL: sprintf(name, "IDA_FIRST_RES_FAIL"); break;
  case IDA_REP_RES_ERR: sprintf(name, "IDA_REP_RES_ERR"); break;
  case IDA_RTFUNC_FAIL: sprintf(name, "IDA_RTFUNC_FAIL"); break;
  case IDA_MEM_FAIL: sprintf(name, "IDA_MEM_FAIL"); break;
  case IDA_MEM_NULL: sprintf(name, "IDA_MEM_NULL"); break;
  case IDA_ILL_INPUT: sprintf(name, "IDA_ILL_INPUT"); break;
  case IDA_NO_MALLOC: sprintf(name, "IDA_NO_MALLOC"); break;
  case IDA_BAD_T: sprintf(name, "IDA_BAD_T"); break;
  case IDA_BAD_K: sprintf(name, "IDA_BAD_K"); break;
  case IDA_BAD_DKY: sprintf(name, "IDA_BAD_DKY"); break;
  case IDA_BAD_EWT: sprintf(name, "IDA_BAD_EWT"); break;
  case IDA_NO_RECOVERY: sprintf(name, "IDA_NO_RECOVERY"); break;
  case IDA_LINESEARCH_FAIL: sprintf(name, "IDA_LINESEARCH_FAIL"); break;
  case IDA_NO_SENS: sprintf(name, "IDA_NO_SENS"); break;
  case IDA_SRES_FAIL: sprintf(name, "IDA_SRES_FAIL"); break;
  case IDA_REP_SRES_ERR: sprintf(name, "IDA_REP_SRES_ERR"); break;
  case IDA_BAD_IS: sprintf(name, "IDA_BAD_IS"); break;
  case IDA_NO_QUAD: sprintf(name, "IDA_NO_QUAD"); break;
  case IDA_NO_QUADSENS: sprintf(name, "IDA_NO_QUADSENS"); break;
  case IDA_QRHS_FAIL: sprintf(name, "IDA_QRHS_FAIL"); break;
  case IDA_REP_QRHS_ERR: sprintf(name, "IDA_REP_QRHS_ERR"); break;
  case IDA_QSRHS_FAIL: sprintf(name, "IDA_QSRHS_FAIL"); break;
  case IDA_REP_QSRHS_ERR:
    sprintf(name, "IDA_REP_QSRHS_ERR");
    break;

    /* IDAA flags follow below. */
  case IDA_NO_ADJ: sprintf(name, "IDA_NO_ADJ"); break;
  case IDA_BAD_TB0: sprintf(name, "IDA_BAD_TB0"); break;
  case IDA_REIFWD_FAIL: sprintf(name, "IDA_REIFWD_FAIL"); break;
  case IDA_FWD_FAIL: sprintf(name, "IDA_FWD_FAIL"); break;
  case IDA_GETY_BADT: sprintf(name, "IDA_GETY_BADT"); break;
  case IDA_NO_BCK: sprintf(name, "IDA_NO_BCK"); break;
  case IDA_NO_FWD: sprintf(name, "IDA_NO_FWD"); break;
  case IDA_NLS_SETUP_FAIL: sprintf(name, "IDA_NLS_SETUP_FAIL"); break;
  case IDA_NLS_FAIL: sprintf(name, "IDA_NLS_FAIL"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}